

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

int32 mkvmuxer::WriteUIntSize(IMkvWriter *writer,uint64 value,int32 size)

{
  int32 iVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar1 = -1;
  if ((uint)size < 9 && writer != (IMkvWriter *)0x0) {
    if (size < 1) {
      iVar3 = 0;
      bVar2 = 7;
      do {
        uVar4 = 1L << (bVar2 & 0x3f);
        iVar3 = iVar3 + 1;
        bVar2 = bVar2 + 7;
        bVar5 = uVar4 - 2 < value;
      } while (bVar5);
      size = iVar3 + (uint)bVar5;
      iVar1 = 0;
      if ((uint)size < 9) goto LAB_00159cf3;
    }
    else {
      uVar4 = 1L << ((char)size * '\a' & 0x3fU);
      if (value <= uVar4 - 2) {
LAB_00159cf3:
        iVar1 = SerializeInt(writer,uVar4 | value,size);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int32 WriteUIntSize(IMkvWriter* writer, uint64 value, int32 size) {
  if (!writer || size < 0 || size > 8)
    return -1;

  if (size > 0) {
    const uint64 bit = 1LL << (size * 7);

    if (value > (bit - 2))
      return -1;

    value |= bit;
  } else {
    size = 1;
    int64 bit;

    for (;;) {
      bit = 1LL << (size * 7);
      const uint64 max = bit - 2;

      if (value <= max)
        break;

      ++size;
    }

    if (size > 8)
      return false;

    value |= bit;
  }

  return SerializeInt(writer, value, size);
}